

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToDecNumber
          (DecimalQuantity *this,StringPiece n,UErrorCode *status)

{
  StringPiece str;
  DecNum decnum;
  DecNum DStack_88;
  
  setBcdToZero(this);
  this->flags = '\0';
  DecNum::DecNum(&DStack_88);
  str._12_4_ = 0;
  str.ptr_ = (char *)SUB128(n._0_12_,0);
  str.length_ = SUB124(n._0_12_,8);
  DecNum::setTo(&DStack_88,str,status);
  _setToDecNum(this,&DStack_88,status);
  MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&DStack_88.fData);
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToDecNumber(StringPiece n, UErrorCode& status) {
    setBcdToZero();
    flags = 0;

    // Compute the decNumber representation
    DecNum decnum;
    decnum.setTo(n, status);

    _setToDecNum(decnum, status);
    return *this;
}